

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

int Aig_ManRegFindBestVar(Aig_ManPre_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int local_3c;
  int local_38;
  int k;
  int i;
  int iVarBest;
  int iVarSupp;
  int iVarFree;
  int nNewVarsBest;
  int nNewVars;
  Vec_Int_t *vSupp;
  Aig_ManPre_t *p_local;
  
  iVarSupp = 1000000000;
  k = -1;
  local_38 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vFreeVars);
    if (iVar1 <= local_38) {
      return k;
    }
    iVar1 = Vec_IntEntry(p->vFreeVars,local_38);
    p_00 = (Vec_Int_t *)Vec_PtrEntry(p->vMatrix,iVar1);
    iVarFree = 0;
    for (local_3c = 0; iVar2 = Vec_IntSize(p_00), local_3c < iVar2; local_3c = local_3c + 1) {
      iVar2 = Vec_IntEntry(p_00,local_3c);
      if (p->pfPartVars[iVar2] == '\0') {
        iVarFree = p->pfUsedRegs[iVar2] * 3 + 1 + iVarFree;
      }
    }
    if (iVarFree == 0) break;
    if (iVarFree < iVarSupp) {
      iVarSupp = iVarFree;
      k = iVar1;
    }
    local_38 = local_38 + 1;
  }
  return iVar1;
}

Assistant:

int Aig_ManRegFindBestVar( Aig_ManPre_t * p )
{
    Vec_Int_t * vSupp;
    int nNewVars, nNewVarsBest = ABC_INFINITY;
    int iVarFree, iVarSupp, iVarBest = -1, i, k;
    // go through the free variables
    Vec_IntForEachEntry( p->vFreeVars, iVarFree, i )
    {
//        if ( p->pfUsedRegs[iVarFree] )
//            continue;
        // get support of this variable
        vSupp = (Vec_Int_t *)Vec_PtrEntry( p->vMatrix, iVarFree );
        // count the number of new vars
        nNewVars = 0;
        Vec_IntForEachEntry( vSupp, iVarSupp, k )
        {
            if ( p->pfPartVars[iVarSupp] )
                continue;
            nNewVars += 1 + 3 * p->pfUsedRegs[iVarSupp];
        }
        // quit if there is no new variables
        if ( nNewVars == 0 )
            return iVarFree;
        // compare the cost of this
        if ( nNewVarsBest > nNewVars )
        {
            nNewVarsBest = nNewVars;
            iVarBest = iVarFree;
        }
    }
    return iVarBest;
}